

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
slang::CommandLine::setPositional
          (CommandLine *this,OptionCallback *cb,string_view valueName,bool isFileName)

{
  runtime_error *this_00;
  string_view valueName_local;
  __shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  valueName_local._M_str = valueName._M_str;
  valueName_local._M_len = valueName._M_len;
  if ((this->positional).super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    std::make_shared<slang::CommandLine::Option>();
    std::__shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2> *)this,
               &local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)
               &((this->positional).
                 super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->valueName,&valueName_local);
    std::
    variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>
    ::operator=((variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>
                 *)(this->positional).
                   super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ,cb);
    ((this->positional).super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->isFileName = isFileName;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can only set one positional argument");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CommandLine::setPositional(OptionCallback cb, string_view valueName, bool isFileName) {
    if (positional)
        throw std::runtime_error("Can only set one positional argument");

    positional = std::make_shared<Option>();
    positional->valueName = valueName;
    positional->storage = cb;
    positional->isFileName = isFileName;
}